

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

SizeOp asmjit::_abi_1_10::a64::armElementTypeToSizeOp
                 (uint32_t vecOpType,RegType regType,uint32_t elementType)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint in_EDX;
  RegType in_SIL;
  uint in_EDI;
  SizeOp op;
  size_t index;
  SizeOpTable *table;
  SizeOpMap *map;
  SizeOp modifiedOp;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  uint local_30;
  uint32_t local_2c;
  ulong local_28;
  undefined1 *local_20;
  byte *local_18;
  uint local_10;
  SizeOp local_1;
  
  if (0x16 < in_EDI) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (7 < in_EDX) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  local_18 = sizeOpMap + (ulong)in_EDI * 4;
  local_20 = sizeOpTable + (ulong)*local_18 * 0x28;
  local_10 = in_EDX;
  local_2c = diff(in_SIL,kARM_VecB);
  uVar2 = diff(kARM_VecV,kARM_VecB);
  local_30 = uVar2 + 1;
  uVar3 = Support::min<unsigned_int>(&local_2c,&local_30);
  local_28 = (ulong)(uVar3 << 3 | local_10);
  local_1.value = local_20[local_28] & local_18[1];
  bVar1 = Support::bitTest<unsigned_short,unsigned_char>(0,'\0');
  if (!bVar1) {
    SizeOp::makeInvalid(&local_1);
  }
  return (SizeOp)local_1.value;
}

Assistant:

static inline SizeOp armElementTypeToSizeOp(uint32_t vecOpType, RegType regType, uint32_t elementType) noexcept {
  // Instruction data or Assembler is wrong if this triggers an assertion failure.
  ASMJIT_ASSERT(vecOpType < InstDB::kVO_Count);
  // ElementType uses 3 bits in the operand signature, it should never overflow.
  ASMJIT_ASSERT(elementType <= 0x7u);

  const SizeOpMap& map = sizeOpMap[vecOpType];
  const SizeOpTable& table = sizeOpTable[map.tableId];

  size_t index = (Support::min<uint32_t>(diff(regType, RegType::kARM_VecB), diff(RegType::kARM_VecV, RegType::kARM_VecB) + 1) << 3) | elementType;
  SizeOp op = table.array[index];
  SizeOp modifiedOp { uint8_t(op.value & map.sizeOpMask) };

  if (!Support::bitTest(map.acceptMask, op.value))
    modifiedOp.makeInvalid();

  return modifiedOp;
}